

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall Pathie::Path::operator/=(Path *this,string *str)

{
  string local_58 [32];
  Path local_38;
  string *local_18;
  string *str_local;
  Path *this_local;
  
  local_18 = str;
  str_local = &this->m_path;
  std::__cxx11::string::string(local_58,(string *)str);
  join(&local_38,this,(string *)local_58);
  operator=(this,&local_38);
  ~Path(&local_38);
  std::__cxx11::string::~string(local_58);
  return this;
}

Assistant:

Path& Path::operator/=(std::string str)
{
  *this = join(str);
  return *this;
}